

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_extract2_i32_riscv32
               (TCGContext_conflict9 *tcg_ctx,TCGv_i32 ret,TCGv_i32 al,TCGv_i32 ah,uint ofs)

{
  TCGOp *pTVar1;
  uintptr_t o;
  uintptr_t o_1;
  uintptr_t o_3;
  
  if (ofs == 0x20) {
    if (ret != ah) {
      pTVar1 = tcg_emit_op_riscv32(tcg_ctx,INDEX_op_mov_i32);
      pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
      pTVar1->args[1] = (TCGArg)(ah + (long)tcg_ctx);
    }
  }
  else if (ofs == 0) {
    if (ret != al) {
      pTVar1 = tcg_emit_op_riscv32(tcg_ctx,INDEX_op_mov_i32);
      pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
      pTVar1->args[1] = (TCGArg)(al + (long)tcg_ctx);
    }
  }
  else {
    if (al == ah) {
      tcg_gen_rotri_i32_riscv32(tcg_ctx,ret,al,ofs);
      return;
    }
    pTVar1 = tcg_emit_op_riscv32(tcg_ctx,INDEX_op_extract2_i32);
    pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar1->args[1] = (TCGArg)(al + (long)tcg_ctx);
    pTVar1->args[2] = (TCGArg)(ah + (long)tcg_ctx);
    pTVar1->args[3] = (ulong)ofs;
  }
  return;
}

Assistant:

void tcg_gen_extract2_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 al, TCGv_i32 ah,
                          unsigned int ofs)
{
    tcg_debug_assert(ofs <= 32);
    if (ofs == 0) {
        tcg_gen_mov_i32(tcg_ctx, ret, al);
    } else if (ofs == 32) {
        tcg_gen_mov_i32(tcg_ctx, ret, ah);
    } else if (al == ah) {
        tcg_gen_rotri_i32(tcg_ctx, ret, al, ofs);
    } else if (TCG_TARGET_HAS_extract2_i32) {
        tcg_gen_op4i_i32(tcg_ctx, INDEX_op_extract2_i32, ret, al, ah, ofs);
    } else {
        TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_shri_i32(tcg_ctx, t0, al, ofs);
        tcg_gen_deposit_i32(tcg_ctx, ret, t0, ah, 32 - ofs, ofs);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
}